

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O3

void __thiscall Fl_Pixmap::delete_data(Fl_Pixmap *this)

{
  char *pcVar1;
  char **ppcVar2;
  int iVar3;
  long lVar4;
  
  if (this->alloc_data != 0) {
    iVar3 = (this->super_Fl_Image).count_;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        pcVar1 = (this->super_Fl_Image).data_[lVar4];
        if (pcVar1 != (char *)0x0) {
          operator_delete__(pcVar1);
          iVar3 = (this->super_Fl_Image).count_;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    ppcVar2 = (this->super_Fl_Image).data_;
    if (ppcVar2 != (char **)0x0) {
      operator_delete__(ppcVar2);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Pixmap::delete_data() {
  if (alloc_data) {
    for (int i = 0; i < count(); i ++) delete[] (char *)data()[i];
    delete[] (char **)data();
  }
}